

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DifferentTrumpRule.h
# Opt level: O1

bool __thiscall DifferentTrumpRule::isTrump(DifferentTrumpRule *this,bool previous,Card *card)

{
  __normal_iterator<Card_*,_std::vector<Card,_std::allocator<Card>_>_> _Var1;
  vector<Card,_std::allocator<Card>_> local_30;
  Card local_18;
  
  std::vector<Card,_std::allocator<Card>_>::vector(&local_30,&this->m_trumpCards);
  local_18 = *card;
  _Var1 = std::
          __find_if<__gnu_cxx::__normal_iterator<Card*,std::vector<Card,std::allocator<Card>>>,__gnu_cxx::__ops::_Iter_equals_val<Card_const>>
                    (local_30.super__Vector_base<Card,_std::allocator<Card>_>._M_impl.
                     super__Vector_impl_data._M_start,
                     local_30.super__Vector_base<Card,_std::allocator<Card>_>._M_impl.
                     super__Vector_impl_data._M_finish);
  if (local_30.super__Vector_base<Card,_std::allocator<Card>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_30.super__Vector_base<Card,_std::allocator<Card>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  return _Var1._M_current !=
         local_30.super__Vector_base<Card,_std::allocator<Card>_>._M_impl.super__Vector_impl_data.
         _M_finish;
}

Assistant:

virtual bool isTrump(bool previous, const Card &card){
        return contains(m_trumpCards, card);
    }